

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zt-ast.c
# Opt level: O1

void ztast_destroy_statements(ztast_t *ast,ztast_statement_t *statements)

{
  ztast_expr *pzVar1;
  ztast_statement *pzVar2;
  long lVar3;
  ztast_value zVar4;
  
  if (statements != (ztast_statement_t *)0x0) {
    do {
      if (statements->type == ZTSTMT_ASSIGNMENT) {
        pzVar1 = ((statements->u).assignment)->expr;
        switch(pzVar1->type) {
        case ZTEXPR_VALUE:
          break;
        case ZTEXPR_SCOPE:
          ztast_destroy_statements(ast,(ztast_statement_t *)*(pzVar1->data).value);
          break;
        case ZTEXPR_INTARRAY:
          zVar4 = *(pzVar1->data).value;
          if (zVar4 != (ztast_value)0x0) {
LAB_001037a8:
            if (ast->freefn != (ztast_freefn_t *)0x0) {
              (*ast->freefn)(*(void **)((long)zVar4 + 8),ast->opaque);
            }
            if (ast->freefn != (ztast_freefn_t *)0x0) {
              (*ast->freefn)((void *)zVar4,ast->opaque);
            }
          }
          break;
        case ZTEXPR_SCOPEARRAY:
          zVar4 = *(ztast_value *)pzVar1->data;
          if (zVar4 != (ztast_value)0x0) {
            if (0 < *(int *)zVar4) {
              lVar3 = 0;
              do {
                ztast_destroy_statements
                          (ast,(ztast_statement_t *)
                               **(undefined8 **)(*(long *)((long)zVar4 + 8) + lVar3 * 8));
                if (ast->freefn != (ztast_freefn_t *)0x0) {
                  (*ast->freefn)(*(void **)(*(long *)((long)zVar4 + 8) + lVar3 * 8),ast->opaque);
                }
                lVar3 = lVar3 + 1;
              } while (lVar3 < *(int *)zVar4);
            }
            goto LAB_001037a8;
          }
          break;
        default:
          goto switchD_00103737_default;
        }
        if (ast->freefn != (ztast_freefn_t *)0x0) {
          (*ast->freefn)((pzVar1->data).value,ast->opaque);
        }
switchD_00103737_default:
        if (ast->freefn != (ztast_freefn_t *)0x0) {
          (*ast->freefn)(pzVar1,ast->opaque);
        }
        if (ast->freefn != (ztast_freefn_t *)0x0) {
          (*ast->freefn)(((statements->u).assignment)->id,ast->opaque);
        }
        if (ast->freefn != (ztast_freefn_t *)0x0) {
          (*ast->freefn)((statements->u).assignment,ast->opaque);
        }
      }
      pzVar2 = statements->next;
      if (ast->freefn != (ztast_freefn_t *)0x0) {
        (*ast->freefn)(statements,ast->opaque);
      }
      statements = pzVar2;
    } while (pzVar2 != (ztast_statement *)0x0);
  }
  return;
}

Assistant:

static void ztast_destroy_statements(ztast_t           *ast,
                                     ztast_statement_t *statements)
{
  ztast_statement_t *st;
  ztast_statement_t *next;

  if (statements == NULL)
    return; /* no statements */

  for (st = statements; st != NULL; st = next)
  {
    switch (st->type)
    {
    case ZTSTMT_ASSIGNMENT:
      ztast_destroy_expr(ast, st->u.assignment->expr);
      ZTAST_FREE(st->u.assignment->id);
      ZTAST_FREE(st->u.assignment);
      break;

    default:
      assert(0);
      break;
    }
    next = st->next;
    ZTAST_FREE(st);
  }
}